

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

uint64_t __thiscall fmp4_stream::ingest_stream::get_duration(ingest_stream *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  size_type sVar3;
  reference pvVar4;
  uint64_t uVar5;
  ingest_stream *this_local;
  
  sVar3 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
          size(&this->media_fragment_);
  if (sVar3 < 2) {
    sVar3 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
            size(&this->media_fragment_);
    if (sVar3 == 1) {
      sVar3 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
              ::size(&this->media_fragment_);
      pvVar4 = std::
               vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
               operator[](&this->media_fragment_,sVar3 - 1);
      this_local = (ingest_stream *)media_fragment::get_duration(pvVar4);
    }
    else {
      this_local = (ingest_stream *)0x0;
    }
  }
  else {
    sVar3 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
            size(&this->media_fragment_);
    pvVar4 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,sVar3 - 1);
    uVar1 = (pvVar4->tfdt_).base_media_decode_time_;
    pvVar4 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,0);
    uVar2 = (pvVar4->tfdt_).base_media_decode_time_;
    sVar3 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
            size(&this->media_fragment_);
    pvVar4 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,sVar3 - 1);
    uVar5 = media_fragment::get_duration(pvVar4);
    this_local = (ingest_stream *)((uVar1 - uVar2) + uVar5);
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t ingest_stream::get_duration() 
	{
		if (media_fragment_.size() >= 2) 
		{
			// todo add aditional checks for timing behavior
			return media_fragment_[media_fragment_.size() - 1].tfdt_.base_media_decode_time_
				- media_fragment_[0].tfdt_.base_media_decode_time_
				+ media_fragment_[media_fragment_.size() - 1].get_duration();
		}
		if (media_fragment_.size() == 1)
		{
			// todo add aditional checks for timing behavior
			return media_fragment_[media_fragment_.size() - 1].get_duration();
		}
		return 0;
	}